

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASBase.hpp
# Opt level: O2

Uint32 __thiscall
Diligent::BottomLevelASBase<Diligent::EngineVkImplTraits>::GetGeometryIndex
          (BottomLevelASBase<Diligent::EngineVkImplTraits> *this,char *Name)

{
  Uint32 UVar1;
  const_iterator cVar2;
  char (*in_R8) [49];
  undefined1 local_41;
  string msg;
  char *Name_local;
  
  Name_local = Name;
  if ((Name == (char *)0x0) || (*Name == '\0')) {
    FormatString<char[32]>(&msg,(char (*) [32])"Geometry name must not be empty");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetGeometryIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BottomLevelASBase.hpp"
               ,0x98);
    std::__cxx11::string::~string((string *)&msg);
  }
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg,Name,false);
  cVar2 = std::
          _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_NameToIndex)._M_h,(key_type *)&msg);
  HashMapStringKey::Clear((HashMapStringKey *)&msg);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
      ._M_cur == (__node_type *)0x0) {
    local_41 = 0x27;
    FormatString<char[32],char_const*,char>
              (&msg,(Diligent *)"Can\'t find geometry with name \'",(char (*) [32])&Name_local,
               (char **)&local_41,*in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&msg);
    UVar1 = 0xffffffff;
  }
  else {
    UVar1 = *(Uint32 *)
             ((long)cVar2.
                    super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
                    ._M_cur + 0x1c);
    if (UVar1 == 0xffffffff) {
      FormatString<char[21],char_const*,char[49]>
                (&msg,(Diligent *)"Geometry with name \'",(char (*) [21])&Name_local,
                 (char **)"\', exists, but was not enabled in the last build",in_R8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetGeometryIndex",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BottomLevelASBase.hpp"
                 ,0x9d);
      std::__cxx11::string::~string((string *)&msg);
      UVar1 = *(Uint32 *)
               ((long)cVar2.
                      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
                      ._M_cur + 0x1c);
    }
  }
  return UVar1;
}

Assistant:

GetGeometryIndex(const char* Name) const override final
    {
        DEV_CHECK_ERR(Name != nullptr && Name[0] != '\0', "Geometry name must not be empty");

        auto iter = m_NameToIndex.find(Name);
        if (iter != m_NameToIndex.end())
        {
            VERIFY(iter->second.ActualIndex != INVALID_INDEX, "Geometry with name '", Name, "', exists, but was not enabled in the last build");
            return iter->second.ActualIndex;
        }
        LOG_ERROR_MESSAGE("Can't find geometry with name '", Name, '\'');
        return INVALID_INDEX;
    }